

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **ppuVar1;
  size_t *outlen;
  uchar *data;
  uint8_t *private_key;
  uchar *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  BIGNUM *pBVar10;
  size_t sVar11;
  uchar *puVar12;
  void **ppvVar13;
  LIBSSH2_CRYPT_METHOD *pLVar14;
  _LIBSSH2_MAC_METHOD *p_Var15;
  LIBSSH2_COMP_METHOD *pLVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  void **ppvVar20;
  size_t sVar21;
  uint uVar22;
  EVP_MD_CTX *fingerprint_ctx;
  void **local_a0;
  uchar *server_public_key;
  uint local_8c;
  uchar *server_host_key;
  uint local_7c;
  uchar *local_78;
  size_t *local_70;
  size_t server_public_key_len;
  uchar *s;
  uchar *local_58;
  ulong local_50;
  kmdhgGPshakex_state_t *local_48;
  uchar **local_40;
  size_t hostkey_len;
  
  iVar6 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    break;
  default:
    goto switchD_0010e16e_caseD_1;
  case libssh2_NB_state_created:
    goto switchD_0010e16e_caseD_2;
  case libssh2_NB_state_sent:
    sVar21 = key_state->request_len;
    goto LAB_0010e233;
  case libssh2_NB_state_sent1:
    goto switchD_0010e16e_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_0010e16e_caseD_5;
  }
  key_state->public_key_oct = (uchar *)0x0;
  key_state->state = libssh2_NB_state_created;
switchD_0010e16e_caseD_2:
  s = (uchar *)0x0;
  pcVar17 = session->kex->name;
  iVar6 = strcmp(pcVar17,"curve25519-sha256@libssh.org");
  if ((iVar6 == 0) || (iVar6 = strcmp(pcVar17,"curve25519-sha256"), iVar6 == 0)) {
    iVar6 = _libssh2_curve25519_new
                      (session,&key_state->curve25519_public_key,&key_state->curve25519_private_key)
    ;
    if (iVar6 != 0) {
      pcVar17 = "Unable to create private key";
      goto LAB_0010e370;
    }
    key_state->request[0] = '\x1e';
    s = key_state->request + 1;
    _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
    key_state->request_len = 0x25;
    key_state->state = libssh2_NB_state_sent;
    sVar21 = 0x25;
LAB_0010e233:
    iVar6 = _libssh2_transport_send(session,key_state->request,sVar21,(uchar *)0x0,0);
    if (iVar6 == -0x25) {
      return -0x25;
    }
    if (iVar6 != 0) {
      pcVar17 = "Unable to send ECDH_INIT";
      goto LAB_0010e370;
    }
    key_state->state = libssh2_NB_state_sent1;
switchD_0010e16e_caseD_4:
    iVar6 = _libssh2_packet_require
                      (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                       &key_state->req_state);
    if (iVar6 == -0x25) {
      return -0x25;
    }
    if (iVar6 != 0) {
      pcVar17 = "Timeout waiting for ECDH_REPLY reply";
      goto LAB_0010e370;
    }
    key_state->state = libssh2_NB_state_sent2;
switchD_0010e16e_caseD_5:
    uVar19 = key_state->data_len;
    if (4 < uVar19) {
      local_48 = &key_state->exchange_state;
      iVar6 = 0;
      if (libssh2_NB_state_sent2 < local_48->state) goto switchD_0010e306_caseD_1;
      puVar12 = key_state->data;
      data = key_state->curve25519_public_key;
      private_key = key_state->curve25519_private_key;
      switch(local_48->state) {
      case libssh2_NB_state_idle:
        pBVar10 = BN_new();
        (key_state->exchange_state).k = (BIGNUM *)pBVar10;
        (key_state->exchange_state).state = libssh2_NB_state_created;
        break;
      default:
        goto switchD_0010e306_caseD_1;
      case libssh2_NB_state_created:
        break;
      case libssh2_NB_state_sent:
        goto switchD_0010e306_caseD_3;
      case libssh2_NB_state_sent2:
        goto switchD_0010e306_caseD_5;
      }
      local_58 = puVar12 + 1;
      s = puVar12;
      local_50 = uVar19;
      iVar6 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
      if (iVar6 != 0) {
        pcVar17 = "Unexpected curve25519 key length 2";
LAB_0010e354:
        iVar6 = -0xe;
        goto LAB_0010eabd;
      }
      session->server_hostkey_len = (uint32_t)hostkey_len;
      puVar12 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
      session->server_hostkey = puVar12;
      if (puVar12 == (uchar *)0x0) {
        pcVar17 = "Unable to allocate memory for a copy of the host curve25519 key";
LAB_0010e48d:
        iVar6 = -6;
        goto LAB_0010eabd;
      }
      memcpy(puVar12,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
             (ulong)session->server_hostkey_len);
      iVar6 = _libssh2_sha1_init(&fingerprint_ctx);
      if (((iVar6 == 0) ||
          (iVar6 = _libssh2_sha1_update
                             (&fingerprint_ctx,session->server_hostkey,
                              (ulong)session->server_hostkey_len), iVar6 == 0)) ||
         (iVar6 = _libssh2_sha1_final(&fingerprint_ctx,session->server_hostkey_sha1), iVar6 == 0)) {
        iVar6 = 0;
      }
      else {
        iVar6 = 1;
      }
      session->server_hostkey_sha1_valid = iVar6;
      iVar6 = _libssh2_sha256_init(&fingerprint_ctx);
      if (((iVar6 == 0) ||
          (iVar6 = _libssh2_sha256_update
                             (&fingerprint_ctx,session->server_hostkey,
                              (ulong)session->server_hostkey_len), iVar6 == 0)) ||
         (iVar6 = _libssh2_sha256_final(&fingerprint_ctx,session->server_hostkey_sha256), iVar6 == 0
         )) {
        iVar6 = 0;
      }
      else {
        iVar6 = 1;
      }
      session->server_hostkey_sha256_valid = iVar6;
      iVar6 = (*session->hostkey->init)
                        (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                         &session->server_hostkey_abstract);
      if (iVar6 != 0) {
        pcVar17 = "Unable to initialize hostkey importer curve25519";
        goto LAB_0010e482;
      }
      iVar6 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
      if (iVar6 != 0) {
        pcVar17 = "Unexpected curve25519 key length";
        goto LAB_0010e354;
      }
      if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
        ppuVar1 = &(key_state->exchange_state).h_sig;
        outlen = &(key_state->exchange_state).h_sig_len;
        local_a0 = &session->server_hostkey_abstract;
        iVar6 = _libssh2_get_string((string_buf *)&s,ppuVar1,outlen);
        if (iVar6 != 0) {
          pcVar17 = "Unexpected curve25519 server sig length";
          goto LAB_0010e482;
        }
        local_70 = outlen;
        iVar6 = _libssh2_curve25519_gen_k
                          (&(key_state->exchange_state).k,private_key,
                           (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
        if (iVar6 != 0) {
          pcVar17 = "Unable to create curve25519 shared secret";
          iVar6 = -5;
          goto LAB_0010eabd;
        }
        local_40 = ppuVar1;
        iVar6 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        (key_state->exchange_state).k_value_len = (long)((iVar6 + 7) / 8 + 5);
        uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        sVar21 = (key_state->exchange_state).k_value_len;
        if ((uVar7 & 7) != 0) {
          sVar21 = sVar21 - 1;
          (key_state->exchange_state).k_value_len = sVar21;
        }
        puVar12 = (uchar *)(*session->alloc)(sVar21,&session->abstract);
        (key_state->exchange_state).k_value = puVar12;
        if (puVar12 == (uchar *)0x0) {
          pcVar17 = "Unable to allocate buffer for K";
          goto LAB_0010e48d;
        }
        _libssh2_htonu32(puVar12,(int)(key_state->exchange_state).k_value_len - 4);
        uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        if ((uVar7 & 7) == 0) {
          (key_state->exchange_state).k_value[4] = '\0';
          pBVar10 = (BIGNUM *)(key_state->exchange_state).k;
          puVar12 = (key_state->exchange_state).k_value + 5;
        }
        else {
          pBVar10 = (BIGNUM *)(key_state->exchange_state).k;
          puVar12 = (key_state->exchange_state).k_value + 4;
        }
        iVar6 = BN_bn2bin(pBVar10,puVar12);
        if (iVar6 < 1) {
          pcVar17 = "Can\'t write exchange_state->e";
          iVar6 = -0x29;
          goto LAB_0010eabd;
        }
        iVar6 = _libssh2_sha256_init(&fingerprint_ctx);
        if (iVar6 == 0) {
LAB_0010e8b5:
          pcVar17 = "Unable to verify hostkey signature curve25519";
          iVar6 = -0xb;
          goto LAB_0010eabd;
        }
        (key_state->exchange_state).exchange_hash = &fingerprint_ctx;
        puVar2 = (session->local).banner;
        puVar12 = (key_state->exchange_state).h_sig_comp;
        local_78 = puVar12;
        if (puVar2 == (uchar *)0x0) {
          _libssh2_htonu32(puVar12,0x1a);
          uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,4);
          local_8c = _libssh2_sha256_update(&fingerprint_ctx,"SSH-2.0-libssh2_1.11.2_DEV",0x1a);
          local_8c = local_8c & uVar7;
        }
        else {
          sVar11 = strlen((char *)puVar2);
          puVar12 = local_78;
          _libssh2_htonu32(local_78,(int)sVar11 - 2);
          uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,4);
          puVar12 = (session->local).banner;
          sVar11 = strlen((char *)puVar12);
          local_8c = _libssh2_sha256_update(&fingerprint_ctx,puVar12,sVar11 - 2);
          local_8c = local_8c & uVar7;
        }
        local_8c = local_8c & 1;
        sVar11 = strlen((char *)(session->remote).banner);
        puVar2 = local_78;
        _libssh2_htonu32(local_78,(uint32_t)sVar11);
        local_7c = _libssh2_sha256_update(&fingerprint_ctx,puVar2,4);
        puVar12 = (session->remote).banner;
        sVar11 = strlen((char *)puVar12);
        uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,sVar11);
        uVar7 = uVar7 & local_7c;
        _libssh2_htonu32(puVar2,(uint32_t)(session->local).kexinit_len);
        uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar2,4);
        uVar9 = _libssh2_sha256_update
                          (&fingerprint_ctx,(session->local).kexinit,(session->local).kexinit_len);
        local_8c = uVar9 & uVar8 & uVar7 & local_8c;
        _libssh2_htonu32(puVar2,(uint32_t)(session->remote).kexinit_len);
        uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar2,4);
        uVar8 = _libssh2_sha256_update
                          (&fingerprint_ctx,(session->remote).kexinit,(session->remote).kexinit_len)
        ;
        _libssh2_htonu32(puVar2,session->server_hostkey_len);
        uVar9 = _libssh2_sha256_update(&fingerprint_ctx,puVar2,4);
        local_7c = _libssh2_sha256_update
                             (&fingerprint_ctx,session->server_hostkey,
                              (ulong)session->server_hostkey_len);
        local_7c = local_7c & uVar9 & uVar8 & uVar7;
        _libssh2_htonu32(puVar2,0x20);
        uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar2,4);
        uVar7 = uVar7 & local_7c;
        uVar8 = _libssh2_sha256_update(&fingerprint_ctx,data,0x20);
        uVar22 = uVar8 & uVar7 & local_8c;
        _libssh2_htonu32(puVar2,(uint32_t)server_public_key_len);
        uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar2,4);
        uVar8 = _libssh2_sha256_update
                          (&fingerprint_ctx,
                           (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                           CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
        uVar9 = _libssh2_sha256_update
                          (&fingerprint_ctx,(key_state->exchange_state).k_value,
                           (key_state->exchange_state).k_value_len);
        if ((((uVar8 & uVar7 & uVar22 & uVar9) == 0) ||
            (iVar6 = _libssh2_sha256_final(&fingerprint_ctx,local_78), iVar6 == 0)) ||
           (iVar6 = (*session->hostkey->sig_verify)
                              (session,*local_40,*local_70,local_78,0x20,local_a0), iVar6 != 0))
        goto LAB_0010e8b5;
        (key_state->exchange_state).c = '\x15';
        (key_state->exchange_state).state = libssh2_NB_state_sent;
switchD_0010e306_caseD_3:
        iVar6 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
        if (iVar6 == -0x25) {
          return -0x25;
        }
        if (iVar6 != 0) {
          pcVar17 = "Unable to send NEWKEYS message curve25519";
          goto LAB_0010eabd;
        }
        local_48->state = libssh2_NB_state_sent2;
switchD_0010e306_caseD_5:
        ppuVar1 = &(key_state->exchange_state).tmp;
        iVar6 = _libssh2_packet_require
                          (session,'\x15',ppuVar1,&(key_state->exchange_state).tmp_len,0,
                           (uchar *)0x0,0,&(key_state->exchange_state).req_state);
        if (iVar6 == -0x25) {
          return -0x25;
        }
        if (iVar6 != 0) {
          pcVar17 = "Timed out waiting for NEWKEYS curve25519";
          goto LAB_0010eabd;
        }
        *(byte *)&session->state = (byte)session->state | 4;
        (*session->free)(*ppuVar1,&session->abstract);
        if (session->session_id == (uchar *)0x0) {
          puVar12 = (uchar *)(*session->alloc)(0x20,&session->abstract);
          session->session_id = puVar12;
          if (puVar12 == (uchar *)0x0) {
            pcVar17 = "Unable to allocate buffer for SHA digest";
            goto LAB_0010e48d;
          }
          uVar3 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
          uVar4 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
          uVar5 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
          *(undefined8 *)(puVar12 + 0x10) =
               *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
          *(undefined8 *)(puVar12 + 0x18) = uVar5;
          *(undefined8 *)puVar12 = uVar3;
          *(undefined8 *)(puVar12 + 8) = uVar4;
          session->session_id_len = 0x20;
        }
        pLVar14 = (session->local).crypt;
        if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*pLVar14->dtor)(session,&(session->local).crypt_abstract);
          pLVar14 = (session->local).crypt;
        }
        if (pLVar14->init !=
            (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
             *)0x0) {
          server_public_key._0_4_ = 0;
          server_host_key._0_4_ = 0;
          ppvVar13 = (void **)(*session->alloc)((long)pLVar14->iv_len + 0x20,&session->abstract);
          if (ppvVar13 != (void **)0x0) {
            puVar12 = (key_state->exchange_state).h_sig_comp;
            uVar19 = 0;
            do {
              pLVar14 = (session->local).crypt;
              if ((ulong)(long)pLVar14->iv_len <= uVar19) {
                local_a0 = (void **)(*session->alloc)((long)pLVar14->secret_len + 0x20,
                                                      &session->abstract);
                if (local_a0 == (void **)0x0) goto LAB_0010ee76;
                uVar19 = 0;
                local_70 = (size_t *)puVar12;
                goto LAB_0010eb2f;
              }
              iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
              if (((iVar6 == 0) ||
                  (iVar6 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                      (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
                 (iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar12,0x20), iVar6 == 0))
              break;
              uVar18 = uVar19;
              ppvVar20 = ppvVar13;
              if (uVar19 == 0) {
                iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"A",1);
                if (iVar6 == 0) break;
                uVar18 = (ulong)session->session_id_len;
                ppvVar20 = (void **)session->session_id;
              }
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar20,uVar18);
              if (iVar6 == 0) break;
              iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar13 + uVar19));
              uVar19 = uVar19 + 0x20;
            } while (iVar6 != 0);
            (*session->free)(ppvVar13,&session->abstract);
          }
          iVar6 = -1;
          goto switchD_0010e306_caseD_1;
        }
LAB_0010ec75:
        pLVar14 = (session->remote).crypt;
        if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*pLVar14->dtor)(session,&(session->remote).crypt_abstract);
          pLVar14 = (session->remote).crypt;
        }
        if (pLVar14->init !=
            (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
             *)0x0) {
          server_public_key._0_4_ = 0;
          server_host_key._0_4_ = 0;
          ppvVar13 = (void **)(*session->alloc)((long)pLVar14->iv_len + 0x20,&session->abstract);
          if (ppvVar13 == (void **)0x0) goto LAB_0010ee7d;
          puVar12 = (key_state->exchange_state).h_sig_comp;
          uVar19 = 0;
          while (pLVar14 = (session->remote).crypt, uVar19 < (ulong)(long)pLVar14->iv_len) {
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar12,0x20), iVar6 == 0))
            goto LAB_0010ee76;
            uVar18 = uVar19;
            ppvVar20 = ppvVar13;
            if (uVar19 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"B",1);
              if (iVar6 == 0) goto LAB_0010ee76;
              uVar18 = (ulong)session->session_id_len;
              ppvVar20 = (void **)session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar20,uVar18);
            if (iVar6 == 0) goto LAB_0010ee76;
            iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar13 + uVar19));
            uVar19 = uVar19 + 0x20;
            if (iVar6 == 0) goto LAB_0010ee76;
          }
          local_70 = (size_t *)puVar12;
          local_a0 = (void **)(*session->alloc)((long)pLVar14->secret_len + 0x20,&session->abstract)
          ;
          if (local_a0 != (void **)0x0) {
            uVar19 = 0;
            goto LAB_0010edb6;
          }
          goto LAB_0010ee76;
        }
LAB_0010ef0f:
        p_Var15 = (session->local).mac;
        if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*p_Var15->dtor)(session,&(session->local).mac_abstract);
          p_Var15 = (session->local).mac;
        }
        if (p_Var15->init == (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
LAB_0010f05e:
          p_Var15 = (session->remote).mac;
          if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var15->dtor)(session,&(session->remote).mac_abstract);
            p_Var15 = (session->remote).mac;
          }
          if (p_Var15->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0)
          {
            server_public_key._0_4_ = 0;
            ppvVar13 = (void **)(*session->alloc)((long)p_Var15->key_len + 0x20,&session->abstract);
            if (ppvVar13 != (void **)0x0) {
              uVar19 = 0;
              do {
                p_Var15 = (session->remote).mac;
                if ((ulong)(long)p_Var15->key_len <= uVar19) {
                  (*p_Var15->init)(session,(uchar *)ppvVar13,(int *)&server_public_key,
                                   &(session->remote).mac_abstract);
                  if ((int)server_public_key != 0) {
                    explicit_bzero(ppvVar13,(long)((session->remote).mac)->key_len);
                    (*session->free)(ppvVar13,&session->abstract);
                  }
                  goto LAB_0010f1ad;
                }
                iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar6 == 0) ||
                    (iVar6 = _libssh2_sha256_update
                                       ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                        (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
                   (iVar6 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20
                                      ), iVar6 == 0)) break;
                uVar18 = uVar19;
                ppvVar20 = ppvVar13;
                if (uVar19 == 0) {
                  iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"F",1);
                  if (iVar6 == 0) break;
                  uVar18 = (ulong)session->session_id_len;
                  ppvVar20 = (void **)session->session_id;
                }
                iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar20,uVar18);
                if (iVar6 == 0) break;
                iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar13 + uVar19));
                uVar19 = uVar19 + 0x20;
              } while (iVar6 != 0);
              goto LAB_0010ee76;
            }
            goto LAB_0010ee7d;
          }
LAB_0010f1ad:
          pLVar16 = (session->local).comp;
          if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
            if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
              (*pLVar16->dtor)(session,1,&(session->local).comp_abstract);
              pLVar16 = (session->local).comp;
              if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_0010f1fd;
            }
            if ((pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) &&
               (iVar6 = (*pLVar16->init)(session,1,&(session->local).comp_abstract), iVar6 != 0))
            goto LAB_0010ee7d;
          }
LAB_0010f1fd:
          pLVar16 = (session->remote).comp;
          iVar6 = 0;
          if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
            if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
              iVar6 = 0;
              (*pLVar16->dtor)(session,0,&(session->remote).comp_abstract);
              pLVar16 = (session->remote).comp;
              if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_0010e306_caseD_1;
            }
            iVar6 = 0;
            if (pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
              iVar6 = (*pLVar16->init)(session,0,&(session->remote).comp_abstract);
              iVar6 = (uint)(iVar6 == 0) * 5 + -5;
            }
          }
          goto switchD_0010e306_caseD_1;
        }
        server_public_key._0_4_ = 0;
        ppvVar13 = (void **)(*session->alloc)((long)p_Var15->key_len + 0x20,&session->abstract);
        if (ppvVar13 != (void **)0x0) {
          uVar19 = 0;
          do {
            p_Var15 = (session->local).mac;
            if ((ulong)(long)p_Var15->key_len <= uVar19) {
              (*p_Var15->init)(session,(uchar *)ppvVar13,(int *)&server_public_key,
                               &(session->local).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(ppvVar13,(long)((session->local).mac)->key_len);
                (*session->free)(ppvVar13,&session->abstract);
              }
              goto LAB_0010f05e;
            }
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar6 == 0)) break;
            uVar18 = uVar19;
            ppvVar20 = ppvVar13;
            if (uVar19 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"E",1);
              if (iVar6 == 0) break;
              uVar18 = (ulong)session->session_id_len;
              ppvVar20 = (void **)session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar20,uVar18);
            if (iVar6 == 0) break;
            iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar13 + uVar19));
            uVar19 = uVar19 + 0x20;
          } while (iVar6 != 0);
          goto LAB_0010ee76;
        }
        goto LAB_0010ee7d;
      }
      pcVar17 = "Unexpected curve25519 server public key length";
LAB_0010e482:
      iVar6 = -10;
LAB_0010eabd:
      iVar6 = _libssh2_error(session,iVar6,pcVar17);
      goto switchD_0010e306_caseD_1;
    }
    iVar6 = _libssh2_error(session,-10,"Data is too short");
    goto LAB_0010ead1;
  }
  pcVar17 = "Unknown KEX curve25519 curve type";
  iVar6 = -1;
LAB_0010e370:
  iVar6 = _libssh2_error(session,iVar6,pcVar17);
  goto switchD_0010e16e_caseD_1;
  while( true ) {
    uVar18 = uVar19;
    ppvVar20 = local_a0;
    if (uVar19 == 0) {
      iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"C",1);
      if (iVar6 == 0) break;
      uVar18 = (ulong)session->session_id_len;
      ppvVar20 = (void **)session->session_id;
    }
    iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar20,uVar18);
    if (iVar6 == 0) break;
    iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)local_a0 + uVar19));
    uVar19 = uVar19 + 0x20;
    if (iVar6 == 0) break;
LAB_0010eb2f:
    pLVar14 = (session->local).crypt;
    if ((ulong)(long)pLVar14->secret_len <= uVar19) {
      iVar6 = (*pLVar14->init)(session,pLVar14,(uchar *)ppvVar13,(int *)&server_public_key,
                               (uchar *)local_a0,(int *)&server_host_key,1,
                               &(session->local).crypt_abstract);
      if (iVar6 != 0) goto LAB_0010eeb1;
      if ((int)server_public_key != 0) {
        explicit_bzero(ppvVar13,(long)((session->local).crypt)->iv_len);
        (*session->free)(ppvVar13,&session->abstract);
      }
      ppvVar13 = local_a0;
      if ((int)server_host_key != 0) {
        explicit_bzero(local_a0,(long)((session->local).crypt)->secret_len);
        (*session->free)(ppvVar13,&session->abstract);
      }
      goto LAB_0010ec75;
    }
    iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
    if (((iVar6 == 0) ||
        (iVar6 = _libssh2_sha256_update
                           ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                            (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
       (iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_70,0x20), iVar6 == 0)) break;
  }
  goto LAB_0010ee67;
LAB_0010eeb1:
  (*session->free)(ppvVar13,&session->abstract);
  ppvVar13 = local_a0;
  goto LAB_0010ee76;
  while( true ) {
    uVar18 = uVar19;
    ppvVar20 = local_a0;
    if (uVar19 == 0) {
      iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"D",1);
      if (iVar6 == 0) break;
      uVar18 = (ulong)session->session_id_len;
      ppvVar20 = (void **)session->session_id;
    }
    iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar20,uVar18);
    if (iVar6 == 0) break;
    iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)local_a0 + uVar19));
    uVar19 = uVar19 + 0x20;
    if (iVar6 == 0) break;
LAB_0010edb6:
    pLVar14 = (session->remote).crypt;
    if ((ulong)(long)pLVar14->secret_len <= uVar19) {
      iVar6 = (*pLVar14->init)(session,pLVar14,(uchar *)ppvVar13,(int *)&server_public_key,
                               (uchar *)local_a0,(int *)&server_host_key,0,
                               &(session->remote).crypt_abstract);
      if (iVar6 != 0) goto LAB_0010eeb1;
      if ((int)server_public_key != 0) {
        explicit_bzero(ppvVar13,(long)((session->remote).crypt)->iv_len);
        (*session->free)(ppvVar13,&session->abstract);
      }
      ppvVar13 = local_a0;
      if ((int)server_host_key != 0) {
        explicit_bzero(local_a0,(long)((session->remote).crypt)->secret_len);
        (*session->free)(ppvVar13,&session->abstract);
      }
      goto LAB_0010ef0f;
    }
    iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
    if (((iVar6 == 0) ||
        (iVar6 = _libssh2_sha256_update
                           ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                            (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
       (iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_70,0x20), iVar6 == 0)) break;
  }
LAB_0010ee67:
  (*session->free)(local_a0,&session->abstract);
LAB_0010ee76:
  (*session->free)(ppvVar13,&session->abstract);
LAB_0010ee7d:
  iVar6 = -5;
switchD_0010e306_caseD_1:
  curve25519_exchange_state_cleanup(session,local_48);
LAB_0010ead1:
  if (iVar6 == -0x25) {
    iVar6 = -0x25;
  }
  else {
switchD_0010e16e_caseD_1:
    kex_method_curve25519_cleanup(session,key_state);
  }
  return iVar6;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }
    }

clean_exit:

    kex_method_curve25519_cleanup(session, key_state);

    return ret;
}